

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Classes.h
# Opt level: O2

void __thiscall
chatra::AsyncOperatorTable::add
          (AsyncOperatorTable *this,Package *package,Node *node,Operator op,
          vector<chatra::ArgumentDef,_std::allocator<chatra::ArgumentDef>_> *args)

{
  Package *local_30;
  Package *package_local;
  Node *node_local;
  value_type *method;
  Operator op_local;
  
  local_30 = package;
  package_local = (Package *)node;
  method._7_1_ = op;
  std::forward_list<chatra::OperatorMethod,std::allocator<chatra::OperatorMethod>>::
  emplace_front<chatra::Package*&,chatra::Node*&,chatra::Operator&,std::vector<chatra::ArgumentDef,std::allocator<chatra::ArgumentDef>>>
            ((forward_list<chatra::OperatorMethod,std::allocator<chatra::OperatorMethod>> *)
             &this->methods,&local_30,(Node **)&package_local,(Operator *)((long)&method + 7),args);
  node_local = (Node *)((this->methods).
                        super__Fwd_list_base<chatra::OperatorMethod,_std::allocator<chatra::OperatorMethod>_>
                        ._M_impl._M_head._M_next + 1);
  AsyncReadWrite<chatra::OperatorTable>::
  writeAsync<chatra::AsyncOperatorTable::add(chatra::Package*,chatra::Node*,chatra::Operator,std::vector<chatra::ArgumentDef,std::allocator<chatra::ArgumentDef>>)::_lambda(chatra::OperatorTable&)_1_>
            (&this->super_AsyncReadWrite<chatra::OperatorTable>,(anon_class_8_1_60e9c21f)&node_local
            );
  return;
}

Assistant:

void add(Package* package, Node* node, Operator op, std::vector<ArgumentDef> args) {
		methods.emplace_front(package, node, op, std::move(args));
		auto method = &methods.front();
		writeAsync([&](OperatorTable& table) {
			if (method->args.size() == 1)
				table.addOp1(method);
			else
				table.addOp2(method);
		});
	}